

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::start(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
        *this,function<void_()> *callback)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<asio::io_context> local_30;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  function<void_()> *callback_local;
  SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_local;
  
  lock._M_device = (mutex_type *)callback;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->start_stop_mutex);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->io_service);
  if (!bVar1) {
    std::make_shared<asio::io_context>();
    std::shared_ptr<asio::io_context>::operator=(&this->io_service,&local_30);
    std::shared_ptr<asio::io_context>::~shared_ptr(&local_30);
    this->internal_io_service = true;
  }
  peVar2 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->io_service);
  bVar1 = asio::io_context::stopped(peVar2);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->io_service);
    restart(peVar2);
  }
  (*this->_vptr_SocketClientBase[2])();
  bVar1 = std::function::operator_cast_to_bool((function *)callback);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->io_service);
    post<std::function<void()>>(peVar2,callback);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  if ((this->internal_io_service & 1U) != 0) {
    peVar2 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->io_service);
    asio::io_context::run(peVar2);
  }
  return;
}

Assistant:

void start(std::function<void()> callback = nullptr) {
      {
        std::lock_guard<std::mutex> lock(start_stop_mutex);

        if(!io_service) {
          io_service = std::make_shared<io_context>();
          internal_io_service = true;
        }

        if(io_service->stopped())
          restart(*io_service);

        connect();

        if(callback)
          post(*io_service, std::move(callback));
      }

      if(internal_io_service)
        io_service->run();
    }